

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool __thiscall
libcellml::Units::UnitsImpl::performTestWithHistory
          (UnitsImpl *this,History *history,UnitsConstPtr *units,TestType type)

{
  bool bVar1;
  element_type *this_00;
  size_t sVar2;
  string *psVar3;
  element_type *peVar4;
  UnitsImpl *pUVar5;
  shared_ptr<const_libcellml::Units> local_1a8;
  undefined1 local_198 [8];
  UnitsPtr childUnits;
  string reference;
  size_t unitIndex;
  shared_ptr<libcellml::Model> local_150;
  shared_ptr<const_libcellml::Units> local_140;
  allocator<char> local_129;
  string local_128;
  ImportedEntity local_108;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  HistoryEpochPtr h;
  undefined1 local_88 [8];
  UnitsPtr importedUnits;
  ImportSource local_60;
  undefined1 local_40 [8];
  ModelPtr model;
  TestType type_local;
  UnitsConstPtr *units_local;
  History *history_local;
  UnitsImpl *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       type;
  std::shared_ptr<libcellml::Model>::shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  bVar1 = ImportedEntity::isImport(&this->mUnits->super_ImportedEntity);
  if (bVar1) {
    ImportedEntity::importSource((ImportedEntity *)&stack0xffffffffffffff90);
    std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&stack0xffffffffffffff90);
    ImportSource::model(&local_60);
    std::shared_ptr<libcellml::Model>::operator=
              ((shared_ptr<libcellml::Model> *)local_40,(shared_ptr<libcellml::Model> *)&local_60);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&local_60);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&stack0xffffffffffffff90);
    bVar1 = std::operator==((shared_ptr<libcellml::Model> *)local_40,(nullptr_t)0x0);
    if (bVar1) {
      this_local._7_1_ = 0;
      importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 1;
    }
    else {
      psVar3 = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      ImportedEntity::importReference_abi_cxx11_
                ((string *)
                 &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&this->mUnits->super_ImportedEntity);
      Model::units((Model *)local_88,psVar3);
      std::__cxx11::string::~string
                ((string *)
                 &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = std::operator==((shared_ptr<libcellml::Units> *)local_88,(nullptr_t)0x0);
      if (bVar1) {
        this_local._7_1_ = false;
        importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
      }
      else {
        ImportedEntity::importSource(&local_108);
        this_00 = std::
                  __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&local_108);
        ImportSource::url_abi_cxx11_(&local_f8,this_00);
        importeeModelUrl(&local_d8,history,&local_f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
        createHistoryEpoch((libcellml *)local_b8,units,&local_d8,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                  ((shared_ptr<libcellml::ImportSource> *)&local_108);
        bVar1 = checkForImportCycles(history,(HistoryEpochPtr *)local_b8);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          std::
          vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ::push_back(history,(value_type *)local_b8);
          peVar4 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
          pUVar5 = Units::pFunc(peVar4);
          std::shared_ptr<libcellml::Units_const>::shared_ptr<libcellml::Units,void>
                    ((shared_ptr<libcellml::Units_const> *)&local_140,
                     (shared_ptr<libcellml::Units> *)local_88);
          this_local._7_1_ =
               performTestWithHistory
                         (pUVar5,history,(UnitsConstPtr *)&local_140,
                          model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_);
          std::shared_ptr<const_libcellml::Units>::~shared_ptr(&local_140);
        }
        importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
        std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr
                  ((shared_ptr<libcellml::HistoryEpoch> *)local_b8);
      }
      std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_88);
    }
  }
  else {
    ParentedEntity::parent((ParentedEntity *)&unitIndex);
    std::dynamic_pointer_cast<libcellml::Model,libcellml::ParentedEntity>
              ((shared_ptr<libcellml::ParentedEntity> *)&local_150);
    std::shared_ptr<libcellml::Model>::operator=
              ((shared_ptr<libcellml::Model> *)local_40,&local_150);
    std::shared_ptr<libcellml::Model>::~shared_ptr(&local_150);
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<libcellml::ParentedEntity> *)&unitIndex);
    for (reference.field_2._8_8_ = 0; sVar2 = unitCount(this->mUnits),
        (ulong)reference.field_2._8_8_ < sVar2;
        reference.field_2._8_8_ = reference.field_2._8_8_ + 1) {
      unitAttributeReference_abi_cxx11_
                ((string *)
                 &childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this->mUnits,reference.field_2._8_8_);
      bVar1 = isStandardUnitName((string *)
                                 &childUnits.
                                  super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
      if (bVar1) {
        importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 4;
      }
      else {
        bVar1 = std::operator!=((shared_ptr<libcellml::Model> *)local_40,(nullptr_t)0x0);
        if (bVar1) {
          psVar3 = (string *)
                   std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
          Model::units((Model *)local_198,psVar3);
          bVar1 = std::operator!=((shared_ptr<libcellml::Units> *)local_198,(nullptr_t)0x0);
          if (bVar1) {
            peVar4 = std::
                     __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_198);
            pUVar5 = Units::pFunc(peVar4);
            std::shared_ptr<libcellml::Units_const>::shared_ptr<libcellml::Units,void>
                      ((shared_ptr<libcellml::Units_const> *)&local_1a8,
                       (shared_ptr<libcellml::Units> *)local_198);
            bVar1 = performTestWithHistory
                              (pUVar5,history,(UnitsConstPtr *)&local_1a8,
                               model.
                               super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_4_);
            std::shared_ptr<const_libcellml::Units>::~shared_ptr(&local_1a8);
            if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00353b0e;
            this_local._7_1_ = 0;
            importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
          else if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._4_4_ == DEFINED) {
            this_local._7_1_ = 0;
            importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
          else {
LAB_00353b0e:
            importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 0;
          }
          std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_198);
          if (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ == 0) goto LAB_00353b4f;
        }
        else if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._4_4_ == DEFINED) {
          this_local._7_1_ = 0;
          importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ = 1;
        }
        else {
LAB_00353b4f:
          importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ = 0;
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if ((importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ != 0) &&
         (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ != 4)) goto LAB_00353bb0;
    }
    this_local._7_1_ = 1;
    importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = 1;
  }
LAB_00353bb0:
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Units::UnitsImpl::performTestWithHistory(History &history, const UnitsConstPtr &units, TestType type) const
{
    ModelPtr model;
    if (mUnits->isImport()) {
        model = mUnits->importSource()->model();
        if (model == nullptr) {
            return false;
        }

        auto importedUnits = model->units(mUnits->importReference());
        if (importedUnits == nullptr) {
            return false;
        }

        auto h = createHistoryEpoch(units, importeeModelUrl(history, mUnits->importSource()->url()));
        if (checkForImportCycles(history, h)) {
            return false;
        }

        history.push_back(h);

        return importedUnits->pFunc()->performTestWithHistory(history, importedUnits, type);
    }

    model = std::dynamic_pointer_cast<libcellml::Model>(mUnits->parent());
    for (size_t unitIndex = 0; unitIndex < mUnits->unitCount(); ++unitIndex) {
        std::string reference = mUnits->unitAttributeReference(unitIndex);
        if (isStandardUnitName(reference)) {
            continue;
        }

        if (model != nullptr) {
            auto childUnits = model->units(reference);
            if (childUnits != nullptr) {
                if (!childUnits->pFunc()->performTestWithHistory(history, childUnits, type)) {
                    return false;
                }
            } else if (type == TestType::DEFINED) {
                return false;
            }
        } else if (type == TestType::DEFINED) {
            return false;
        }
    }

    return true;
}